

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

wally_psbt * cfd::core::MergePsbt(void *src,void *dest,bool ignore_duplicate_error)

{
  int iVar1;
  undefined8 uVar2;
  CfdException *this;
  wally_map *src_00;
  string *in_stack_fffffffffffffdd0;
  wally_map *dst;
  undefined8 in_stack_fffffffffffffdd8;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffde0;
  CfdException *except;
  string local_1b0;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [32];
  CfdSourceLocation local_168;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  CfdSourceLocation local_128;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  int local_cc;
  wally_psbt *pwStack_c8;
  int ret;
  wally_psbt *psbt;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7d;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  wally_psbt *local_30;
  wally_psbt *psbt_dest;
  wally_psbt *psbt_src;
  void *pvStack_18;
  bool ignore_duplicate_error_local;
  void *dest_local;
  void *src_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_30 = (wally_psbt *)dest;
  psbt_dest = (wally_psbt *)src;
  psbt_src._7_1_ = ignore_duplicate_error;
  pvStack_18 = dest;
  dest_local = src;
  if (((*(long *)((long)src + 8) == 0) ||
      (*(long *)((long)src + 0x18) != *(long *)(*(long *)((long)src + 8) + 0x10))) ||
     (*(long *)((long)src + 0x30) != *(long *)(*(long *)((long)src + 8) + 0x28))) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x2d1;
    local_48.funcname = "MergePsbt";
    logger::warn<>(&local_48,"psbt src format error.");
    local_7d = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"psbt src format error.",&local_69);
    CfdException::CfdException(in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
    local_7d = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (((*(long *)((long)dest + 8) != 0) &&
      (*(long *)((long)dest + 0x18) == *(long *)(*(long *)((long)dest + 8) + 0x10))) &&
     (*(long *)((long)dest + 0x30) == *(long *)(*(long *)((long)dest + 8) + 0x28))) {
    pwStack_c8 = (wally_psbt *)0x0;
    local_cc = wally_psbt_clone_alloc((wally_psbt *)src,0,&stack0xffffffffffffff38);
    if (local_cc != 0) {
      local_e8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_e8.filename = local_e8.filename + 1;
      local_e8.line = 0x2de;
      local_e8.funcname = "MergePsbt";
      logger::warn<int&>(&local_e8,"wally_psbt_clone_alloc NG[{}]",&local_cc);
      local_10a = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_108,"psbt clone error.",&local_109);
      CfdException::CfdException(in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
      local_10a = 0;
      __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar1 = memcmp(pwStack_c8,local_30,5);
    if (iVar1 != 0) {
      local_128.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_128.filename = local_128.filename + 1;
      local_128.line = 0x2e4;
      local_128.funcname = "MergePsbt";
      logger::warn<>(&local_128,"psbt unmatch magic.");
      local_14a = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_148,"psbt unmatch magic error.",&local_149);
      CfdException::CfdException(in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
      local_14a = 0;
      __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (pwStack_c8->version != local_30->version) {
      local_168.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_168.filename = local_168.filename + 1;
      local_168.line = 0x2ea;
      local_168.funcname = "MergePsbt";
      logger::warn<unsigned_int&,unsigned_int_const&>
                (&local_168,"psbt unmatch version: [{},{}]",&pwStack_c8->version,&local_30->version)
      ;
      local_18a = 1;
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_188,"psbt unmatch version error.",&local_189);
      CfdException::CfdException(this,error_code,in_stack_fffffffffffffdd0);
      local_18a = 0;
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    src_00 = &pwStack_c8->unknowns;
    dst = &local_30->unknowns;
    paVar3 = (allocator *)((long)&except + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1b0,"global unknowns",paVar3);
    MergeWallyMap(src_00,dst,&local_1b0,(bool)(psbt_src._7_1_ & 1));
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&except + 7));
    MergePsbtInputs(pwStack_c8,local_30,(bool)(psbt_src._7_1_ & 1));
    MergePsbtOutputs(pwStack_c8,local_30,(bool)(psbt_src._7_1_ & 1));
    return pwStack_c8;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x2d7;
  local_98.funcname = "MergePsbt";
  logger::warn<>(&local_98,"psbt dest format error.");
  psbt._6_1_ = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"psbt dest format error.",(allocator *)((long)&psbt + 7));
  CfdException::CfdException(in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
  psbt._6_1_ = 0;
  __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

struct wally_psbt *MergePsbt(
    const void *src, const void *dest, bool ignore_duplicate_error) {
  const struct wally_psbt *psbt_src =
      static_cast<const struct wally_psbt *>(src);
  const struct wally_psbt *psbt_dest =
      static_cast<const struct wally_psbt *>(dest);

  if ((psbt_src->tx == nullptr) ||
      (psbt_src->num_inputs != psbt_src->tx->num_inputs) ||
      (psbt_src->num_outputs != psbt_src->tx->num_outputs)) {
    warn(CFD_LOG_SOURCE, "psbt src format error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt src format error.");
  }
  if ((psbt_dest->tx == nullptr) ||
      (psbt_dest->num_inputs != psbt_dest->tx->num_inputs) ||
      (psbt_dest->num_outputs != psbt_dest->tx->num_outputs)) {
    warn(CFD_LOG_SOURCE, "psbt dest format error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt dest format error.");
  }

  struct wally_psbt *psbt = nullptr;
  int ret = wally_psbt_clone_alloc(psbt_src, 0, &psbt);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt clone error.");
  }

  try {
    if (memcmp(psbt->magic, psbt_dest->magic, sizeof(psbt->magic)) != 0) {
      warn(CFD_LOG_SOURCE, "psbt unmatch magic.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt unmatch magic error.");
    }
    if (psbt->version != psbt_dest->version) {
      warn(
          CFD_LOG_SOURCE, "psbt unmatch version: [{},{}]", psbt->version,
          psbt_dest->version);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt unmatch version error.");
    }
    MergeWallyMap(
        &psbt->unknowns, &psbt_dest->unknowns, "global unknowns",
        ignore_duplicate_error);

    MergePsbtInputs(psbt, psbt_dest, ignore_duplicate_error);
    MergePsbtOutputs(psbt, psbt_dest, ignore_duplicate_error);
  } catch (const CfdException &except) {
    wally_psbt_free(psbt);
    throw except;
  }
  return psbt;
}